

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::BufferedInputStreamWrapper::skip(BufferedInputStreamWrapper *this,size_t bytes)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  ArrayPtr<unsigned_char> local_60;
  uchar *local_50;
  size_t local_48;
  uchar *local_40;
  void *local_38;
  size_t local_30;
  size_t n;
  size_t local_20;
  size_t local_18;
  size_t bytes_local;
  BufferedInputStreamWrapper *this_local;
  
  local_18 = bytes;
  bytes_local = (size_t)this;
  sVar1 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
  sVar2 = local_18;
  if (sVar1 < bytes) {
    sVar2 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
    uVar3 = local_18 - sVar2;
    local_18 = uVar3;
    sVar2 = ArrayPtr<unsigned_char>::size(&this->buffer);
    if (sVar2 < uVar3) {
      ArrayPtr<const_unsigned_char>::operator=(&this->bufferAvailable,(void *)0x0);
      (*this->inner->_vptr_InputStream[3])(this->inner,local_18);
    }
    else {
      local_40 = (this->buffer).ptr;
      local_38 = (void *)(this->buffer).size_;
      local_30 = InputStream::read(this->inner,(int)local_40,local_38,local_18);
      local_60 = ArrayPtr<unsigned_char>::slice(&this->buffer,local_18,local_30);
      AVar4 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_60);
      local_50 = AVar4.ptr;
      (this->bufferAvailable).ptr = local_50;
      local_48 = AVar4.size_;
      (this->bufferAvailable).size_ = local_48;
    }
  }
  else {
    sVar1 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
    AVar4 = ArrayPtr<const_unsigned_char>::slice(&this->bufferAvailable,sVar2,sVar1);
    n = (size_t)AVar4.ptr;
    (this->bufferAvailable).ptr = (uchar *)n;
    local_20 = AVar4.size_;
    (this->bufferAvailable).size_ = local_20;
  }
  return;
}

Assistant:

void BufferedInputStreamWrapper::skip(size_t bytes) {
  if (bytes <= bufferAvailable.size()) {
    bufferAvailable = bufferAvailable.slice(bytes, bufferAvailable.size());
  } else {
    bytes -= bufferAvailable.size();
    if (bytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer, bytes);
      bufferAvailable = buffer.slice(bytes, n);
    } else {
      // Forward large skip to the underlying stream.
      bufferAvailable = nullptr;
      inner.skip(bytes);
    }
  }
}